

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivatives
          (BeagleCPUImpl<float,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,int *categoryWeightsIndices,
          int *categoryRatesIndices,int *cumulativeScaleIndices,int count,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R9;
  int in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  float *postOrderPartial;
  double *outSumSquaredDerivativesForNode;
  double *outSumDerivativesForNode;
  double *outDerivativesForNode;
  int patternOffset;
  int scalingFactorsIndex;
  int firstDerivativeIndex;
  int *tipStates;
  float *preOrderPartial;
  int nodeNum;
  float *categoryWeights;
  double *categoryRates;
  int secondDerivativeIndex;
  int returnCode;
  long in_stack_ffffffffffffff20;
  undefined4 uVar5;
  long local_c0;
  long local_b8;
  long local_b0;
  int local_5c;
  
  uVar2 = *(undefined8 *)(in_RDI[0x13] + (long)*in_R9 * 8);
  for (local_5c = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20),
      local_5c < in_stack_00000018; local_5c = local_5c + 1) {
    uVar3 = *(undefined8 *)(in_RDI[0x15] + (long)*(int *)(in_RDX + (long)local_5c * 4) * 8);
    lVar4 = *(long *)(in_RDI[0x16] + (long)*(int *)(in_RSI + (long)local_5c * 4) * 8);
    uVar1 = *(undefined4 *)(in_RCX + (long)local_5c * 4);
    if (in_stack_00000020 == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = in_stack_00000020 + (long)(local_5c * *(int *)((long)in_RDI + 0x14)) * 8;
    }
    if (in_stack_00000028 == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = in_stack_00000028 + (long)local_5c * 8;
    }
    if (in_stack_00000030 == 0) {
      local_c0 = 0;
    }
    else {
      local_c0 = in_stack_00000030 + (long)local_5c * 8;
    }
    (**(code **)(*in_RDI + 0x1e0))();
    if (lVar4 == 0) {
      in_stack_ffffffffffffff20 = CONCAT44(uVar5,0xffffffff);
      (**(code **)(*in_RDI + 0x1c0))
                (in_RDI,*(undefined8 *)
                         (in_RDI[0x15] + (long)*(int *)(in_RSI + (long)local_5c * 4) * 8),uVar3,
                 uVar1,0xffffffff,0,uVar2,in_stack_ffffffffffffff20,local_b0,local_b8,local_c0);
    }
    else {
      in_stack_ffffffffffffff20 = local_b0;
      (**(code **)(*in_RDI + 0x1b8))
                (in_RDI,lVar4,uVar3,uVar1,0xffffffff,0,uVar2,local_b0,local_b8,local_c0);
    }
    (**(code **)(*in_RDI + 0x1e8))(in_RDI,local_b0,local_b8,local_c0);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivatives(const int *postBufferIndices,
                                                              const int *preBufferIndices,
                                                              const int *firstDerivativeIndices,
                                                              const int *secondDerivativeIndices,
                                                              const int *categoryWeightsIndices,
                                                              const int *categoryRatesIndices,
                                                              const int *cumulativeScaleIndices,
                                                              int count,
                                                              double *outDerivatives,
                                                              double *outSumDerivatives,
                                                              double *outSumSquaredDerivatives) {

    int returnCode = BEAGLE_SUCCESS;

    const int secondDerivativeIndex = BEAGLE_OP_NONE;
    const double *categoryRates = NULL; // gCategoryRates[categoryRatesIndices[0]]; // TODO Generalize
    const REALTYPE *categoryWeights = gCategoryWeights[categoryWeightsIndices[0]]; // TODO Generalize

    for (int nodeNum = 0; nodeNum < count; nodeNum++) {

        const REALTYPE *preOrderPartial = gPartials[preBufferIndices[nodeNum]];
        const int *tipStates = gTipStates[postBufferIndices[nodeNum]];

        const int firstDerivativeIndex = firstDerivativeIndices[nodeNum];
        const int scalingFactorsIndex = -1; // cumulativeScaleIndices[nodeNum];

        const int patternOffset = nodeNum * kPatternCount;
        double* outDerivativesForNode = (outDerivatives == NULL) ?
                NULL : outDerivatives + patternOffset;
        double* outSumDerivativesForNode = (outSumDerivatives == NULL) ?
                NULL : outSumDerivatives + nodeNum;
        double* outSumSquaredDerivativesForNode = (outSumSquaredDerivatives == NULL) ?
                NULL : outSumSquaredDerivatives + nodeNum;

        resetDerivativeTemporaries();

        if (tipStates != NULL) {

            calcEdgeLogDerivativesStates(tipStates, preOrderPartial, firstDerivativeIndex,
                                        secondDerivativeIndex, categoryRates, categoryWeights,
                                        outDerivativesForNode,
                                        outSumDerivativesForNode,
                                        outSumSquaredDerivativesForNode);

        } else {

            const REALTYPE *postOrderPartial = gPartials[postBufferIndices[nodeNum]];
            calcEdgeLogDerivativesPartials(postOrderPartial, preOrderPartial, firstDerivativeIndex,
                                       secondDerivativeIndex, categoryRates, categoryWeights,
                                       scalingFactorsIndex,
                                       outDerivativesForNode,
                                       outSumDerivativesForNode,
                                       outSumSquaredDerivativesForNode);
        }

        accumulateDerivatives(outDerivativesForNode,
                outSumDerivativesForNode,
                outSumSquaredDerivativesForNode);

    }

    return returnCode;
}